

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  TriggerStep *pTVar1;
  Upsert *pUVar2;
  SrcList *pSVar3;
  TriggerStep **ppTVar4;
  Upsert *pUpsert;
  long lVar5;
  int i;
  long lVar6;
  
  sqlite3WalkExpr(pWalker,pTrigger->pWhen);
  ppTVar4 = &pTrigger->step_list;
  while (pTVar1 = *ppTVar4, pTVar1 != (TriggerStep *)0x0) {
    sqlite3WalkSelect(pWalker,pTVar1->pSelect);
    sqlite3WalkExpr(pWalker,pTVar1->pWhere);
    sqlite3WalkExprList(pWalker,pTVar1->pExprList);
    pUVar2 = pTVar1->pUpsert;
    if (pUVar2 != (Upsert *)0x0) {
      sqlite3WalkExprList(pWalker,pUVar2->pUpsertTarget);
      sqlite3WalkExprList(pWalker,pUVar2->pUpsertSet);
      sqlite3WalkExpr(pWalker,pUVar2->pUpsertWhere);
      sqlite3WalkExpr(pWalker,pUVar2->pUpsertTargetWhere);
    }
    pSVar3 = pTVar1->pFrom;
    if (pSVar3 != (SrcList *)0x0) {
      lVar5 = 0x30;
      for (lVar6 = 0; lVar6 < pSVar3->nSrc; lVar6 = lVar6 + 1) {
        sqlite3WalkSelect(pWalker,*(Select **)((long)pSVar3->a + lVar5 + -8));
        pSVar3 = pTVar1->pFrom;
        lVar5 = lVar5 + 0x68;
      }
    }
    ppTVar4 = &pTVar1->pNext;
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
    if( pStep->pFrom ){
      int i;
      for(i=0; i<pStep->pFrom->nSrc; i++){
        sqlite3WalkSelect(pWalker, pStep->pFrom->a[i].pSelect);
      }
    }
  }
}